

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentShader.hpp
# Opt level: O3

Vector3<double> *
eos::render::compute_inverse_perspectively_correct_lambda<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *lambda_world,double *one_over_w0
          ,double *one_over_w1,double *one_over_w2)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3<double> *lambda;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  
  fVar7 = (float)(1.0 / *one_over_w0);
  auVar6._8_8_ = *one_over_w2;
  auVar6._0_8_ = *one_over_w1;
  auVar6 = divpd(_DAT_0018f1d0,auVar6);
  dVar3 = (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar4 = (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  fVar7 = (float)(((double)fVar7 - (double)(fVar7 - (float)auVar6._0_8_) * dVar3) -
                 dVar4 * (double)(fVar7 - (float)auVar6._8_8_));
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] =
         (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[2];
    dVar3 = (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar3;
    return __return_storage_ptr__;
  }
  dVar2 = (double)fVar7;
  auVar5._0_8_ = dVar3 * (double)(float)auVar6._0_8_;
  auVar5._8_8_ = dVar4 * (double)(float)auVar6._8_8_;
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar6 = divpd(auVar5,auVar1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array + 1) = auVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = (1.0 - auVar6._0_8_) - auVar6._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3<T> compute_inverse_perspectively_correct_lambda(const Eigen::Vector3<T>& lambda_world,
                                                               const T& one_over_w0, const T& one_over_w1,
                                                               const T& one_over_w2)
{
    const float w0 = 1 / one_over_w0;
    const float w1 = 1 / one_over_w1;
    const float w2 = 1 / one_over_w2;

    const float d = w0 - (w0 - w1) * lambda_world.y() - (w0 - w2) * lambda_world.z();
    if (d == 0)
        return lambda_world;

    Eigen::Vector3<T> lambda;

    lambda.z() = lambda_world.z() * w2 / d;
    lambda.y() = lambda_world.y() * w1 / d;

    lambda.x() = 1 - lambda.y() - lambda.z();
    return lambda;
}